

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O3

SourceFileFlags __thiscall
cmGeneratorTarget::GetTargetSourceFileFlags(cmGeneratorTarget *this,cmSourceFile *sf)

{
  int iVar1;
  size_type *psVar2;
  cmMakefile *pcVar3;
  size_type *psVar4;
  cmSourceFile *in_RDX;
  char *pcVar5;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  size_type *psVar6;
  SourceFileFlags SVar7;
  string local_40;
  
  *(undefined4 *)&this->Target = 0;
  this->Makefile = (cmMakefile *)0x0;
  ConstructSourceFileFlags((cmGeneratorTarget *)sf);
  psVar4 = (size_type *)sf[1].Location.Name.field_2._M_allocated_capacity;
  if (psVar4 != (size_type *)0x0) {
    psVar6 = &sf[1].Location.Name._M_string_length;
    psVar2 = psVar6;
    do {
      pcVar5 = (char *)(ulong)((cmSourceFile *)psVar4[4] < in_RDX);
      if ((cmSourceFile *)psVar4[4] >= in_RDX) {
        psVar2 = psVar4;
      }
      psVar4 = (size_type *)psVar4[(long)(pcVar5 + 2)];
    } while (psVar4 != (size_type *)0x0);
    if ((psVar2 != psVar6) && ((cmSourceFile *)psVar2[4] <= in_RDX)) {
      pcVar3 = (cmMakefile *)psVar2[6];
      this->Target = (cmTarget *)psVar2[5];
      this->Makefile = pcVar3;
      goto LAB_004591bd;
    }
  }
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"MACOSX_PACKAGE_LOCATION","");
  pcVar3 = (cmMakefile *)cmSourceFile::GetProperty(in_RDX,&local_40);
  pcVar5 = extraout_RDX;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    pcVar5 = extraout_RDX_00;
  }
  if (pcVar3 != (cmMakefile *)0x0) {
    this->Makefile = pcVar3;
    iVar1 = strcmp((char *)pcVar3,"Resources");
    pcVar5 = extraout_RDX_01;
    if (iVar1 == 0) {
      *(undefined4 *)&this->Target = 3;
    }
    else {
      *(undefined4 *)&this->Target = 4;
    }
  }
LAB_004591bd:
  SVar7.MacFolder = pcVar5;
  SVar7._0_8_ = this;
  return SVar7;
}

Assistant:

struct cmGeneratorTarget::SourceFileFlags
cmGeneratorTarget::GetTargetSourceFileFlags(const cmSourceFile* sf) const
{
  struct SourceFileFlags flags;
  this->ConstructSourceFileFlags();
  std::map<cmSourceFile const*, SourceFileFlags>::iterator si =
    this->SourceFlagsMap.find(sf);
  if(si != this->SourceFlagsMap.end())
    {
    flags = si->second;
    }
  else
    {
    // Handle the MACOSX_PACKAGE_LOCATION property on source files that
    // were not listed in one of the other lists.
    if(const char* location = sf->GetProperty("MACOSX_PACKAGE_LOCATION"))
      {
      flags.MacFolder = location;
      if(strcmp(location, "Resources") == 0)
        {
        flags.Type = cmGeneratorTarget::SourceFileTypeResource;
        }
      else
        {
        flags.Type = cmGeneratorTarget::SourceFileTypeMacContent;
        }
      }
    }
  return flags;
}